

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_IterMulti::_Run(_Test_IterMulti *this)

{
  DB *pDVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 local_3f68 [448];
  undefined1 local_3da8 [448];
  undefined1 local_3be8 [448];
  undefined1 local_3a28 [448];
  undefined1 local_3868 [448];
  undefined1 local_36a8 [448];
  undefined1 local_34e8 [448];
  undefined1 local_3328 [455];
  allocator local_3161;
  string local_3160 [32];
  undefined1 local_3140 [431];
  allocator local_2f91;
  string local_2f90 [39];
  allocator local_2f69;
  string local_2f68 [32];
  undefined1 local_2f48 [431];
  allocator local_2d99;
  string local_2d98 [39];
  allocator local_2d71;
  string local_2d70 [32];
  undefined1 local_2d50 [431];
  allocator local_2ba1;
  string local_2ba0 [39];
  allocator local_2b79;
  string local_2b78 [32];
  undefined1 local_2b58 [431];
  allocator local_29a9;
  string local_29a8 [39];
  allocator local_2981;
  string local_2980 [32];
  undefined1 local_2960 [424];
  undefined1 local_27b8 [448];
  undefined1 local_25f8 [448];
  undefined1 local_2438 [448];
  Slice local_2278;
  undefined1 local_2268 [448];
  Slice local_20a8;
  undefined1 local_2098 [448];
  Slice local_1ed8;
  undefined1 local_1ec8 [448];
  Slice local_1d08;
  undefined1 local_1cf8 [448];
  Slice local_1b38;
  undefined1 local_1b28 [448];
  undefined1 local_1968 [448];
  undefined1 local_17a8 [448];
  undefined1 local_15e8 [448];
  undefined1 local_1428 [448];
  undefined1 local_1268 [448];
  undefined1 local_10a8 [448];
  undefined1 local_ee8 [448];
  undefined1 local_d28 [448];
  undefined1 local_b68 [448];
  undefined1 local_9a8 [448];
  undefined1 local_7e8 [448];
  ReadOptions local_628;
  long *local_610;
  Iterator *iter;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  undefined1 local_5b8 [431];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  undefined1 local_3c0 [431];
  allocator local_211;
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_IterMulti *local_10;
  _Test_IterMulti *this_local;
  
  local_10 = this;
  test::Tester::Tester
            ((Tester *)(local_1b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x33b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"a",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"va",&local_211);
  DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
  test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
  Status::~Status((Status *)local_1b8);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  test::Tester::~Tester((Tester *)(local_1b8 + 8));
  test::Tester::Tester
            ((Tester *)(local_3c0 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x33c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"b",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"vb",&local_409);
  DBTest::Put((DBTest *)local_3c0,(string *)this,(string *)local_3e0);
  test::Tester::IsOk((Tester *)(local_3c0 + 8),(Status *)local_3c0);
  Status::~Status((Status *)local_3c0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  test::Tester::~Tester((Tester *)(local_3c0 + 8));
  test::Tester::Tester
            ((Tester *)(local_5b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x33d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"c",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"vc",(allocator *)((long)&iter + 7));
  DBTest::Put((DBTest *)local_5b8,(string *)this,(string *)local_5d8);
  test::Tester::IsOk((Tester *)(local_5b8 + 8),(Status *)local_5b8);
  Status::~Status((Status *)local_5b8);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)((long)&iter + 7));
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  test::Tester::~Tester((Tester *)(local_5b8 + 8));
  pDVar1 = (this->super_DBTest).db_;
  local_628.verify_checksums = false;
  local_628.fill_cache = false;
  local_628._2_6_ = 0;
  local_628.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_628);
  iVar3 = (*pDVar1->_vptr_DB[6])(pDVar1,&local_628);
  local_610 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*local_610 + 0x18))();
  test::Tester::Tester
            ((Tester *)(local_7e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x341);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_7e8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_7e8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_7e8);
  test::Tester::~Tester((Tester *)(local_7e8 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_9a8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x343);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_9a8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_9a8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_9a8);
  test::Tester::~Tester((Tester *)(local_9a8 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_b68 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x345);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_b68,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_b68 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_b68);
  test::Tester::~Tester((Tester *)(local_b68 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_d28 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x347);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_d28,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_d28 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d28,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_d28);
  test::Tester::~Tester((Tester *)(local_d28 + 0x20));
  (**(code **)(*local_610 + 0x18))();
  test::Tester::Tester
            ((Tester *)(local_ee8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x349);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_ee8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_ee8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_ee8);
  test::Tester::~Tester((Tester *)(local_ee8 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_10a8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x34b);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_10a8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_10a8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a8,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_10a8);
  test::Tester::~Tester((Tester *)(local_10a8 + 0x20));
  (**(code **)(*local_610 + 0x20))();
  test::Tester::Tester
            ((Tester *)(local_1268 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x34e);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1268,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1268 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1268,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_1268);
  test::Tester::~Tester((Tester *)(local_1268 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_1428 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x350);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1428,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1428 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1428,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_1428);
  test::Tester::~Tester((Tester *)(local_1428 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_15e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x352);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_15e8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_15e8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15e8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_15e8);
  test::Tester::~Tester((Tester *)(local_15e8 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_17a8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x354);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_17a8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_17a8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17a8,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_17a8);
  test::Tester::~Tester((Tester *)(local_17a8 + 0x20));
  (**(code **)(*local_610 + 0x20))();
  test::Tester::Tester
            ((Tester *)(local_1968 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x356);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1968,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1968 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1968,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_1968);
  test::Tester::~Tester((Tester *)(local_1968 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_1b28 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x358);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1b28,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1b28 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b28,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_1b28);
  test::Tester::~Tester((Tester *)(local_1b28 + 0x20));
  plVar2 = local_610;
  Slice::Slice(&local_1b38,"");
  (**(code **)(*plVar2 + 0x28))(plVar2,&local_1b38);
  test::Tester::Tester
            ((Tester *)(local_1cf8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x35b);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1cf8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1cf8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1cf8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_1cf8);
  test::Tester::~Tester((Tester *)(local_1cf8 + 0x20));
  plVar2 = local_610;
  Slice::Slice(&local_1d08,"a");
  (**(code **)(*plVar2 + 0x28))(plVar2,&local_1d08);
  test::Tester::Tester
            ((Tester *)(local_1ec8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x35d);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1ec8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1ec8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ec8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_1ec8);
  test::Tester::~Tester((Tester *)(local_1ec8 + 0x20));
  plVar2 = local_610;
  Slice::Slice(&local_1ed8,"ax");
  (**(code **)(*plVar2 + 0x28))(plVar2,&local_1ed8);
  test::Tester::Tester
            ((Tester *)(local_2098 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x35f);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_2098,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_2098 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2098,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_2098);
  test::Tester::~Tester((Tester *)(local_2098 + 0x20));
  plVar2 = local_610;
  Slice::Slice(&local_20a8,"b");
  (**(code **)(*plVar2 + 0x28))(plVar2,&local_20a8);
  test::Tester::Tester
            ((Tester *)(local_2268 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x361);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_2268,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_2268 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2268,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_2268);
  test::Tester::~Tester((Tester *)(local_2268 + 0x20));
  plVar2 = local_610;
  Slice::Slice(&local_2278,"z");
  (**(code **)(*plVar2 + 0x28))(plVar2,&local_2278);
  test::Tester::Tester
            ((Tester *)(local_2438 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x363);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_2438,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_2438 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2438,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_2438);
  test::Tester::~Tester((Tester *)(local_2438 + 0x20));
  (**(code **)(*local_610 + 0x20))();
  (**(code **)(*local_610 + 0x38))();
  (**(code **)(*local_610 + 0x38))();
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_25f8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x36a);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_25f8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_25f8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_25f8,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_25f8);
  test::Tester::~Tester((Tester *)(local_25f8 + 0x20));
  (**(code **)(*local_610 + 0x18))();
  (**(code **)(*local_610 + 0x30))();
  (**(code **)(*local_610 + 0x30))();
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_27b8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x371);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_27b8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_27b8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27b8,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_27b8);
  test::Tester::~Tester((Tester *)(local_27b8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_2960 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x374);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2980,"a",&local_2981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_29a8,"va2",&local_29a9);
  DBTest::Put((DBTest *)local_2960,(string *)this,(string *)local_2980);
  test::Tester::IsOk((Tester *)(local_2960 + 8),(Status *)local_2960);
  Status::~Status((Status *)local_2960);
  std::__cxx11::string::~string(local_29a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_29a9);
  std::__cxx11::string::~string(local_2980);
  std::allocator<char>::~allocator((allocator<char> *)&local_2981);
  test::Tester::~Tester((Tester *)(local_2960 + 8));
  test::Tester::Tester
            ((Tester *)(local_2b58 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x375);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b78,"a2",&local_2b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2ba0,"va3",&local_2ba1);
  DBTest::Put((DBTest *)local_2b58,(string *)this,(string *)local_2b78);
  test::Tester::IsOk((Tester *)(local_2b58 + 8),(Status *)local_2b58);
  Status::~Status((Status *)local_2b58);
  std::__cxx11::string::~string(local_2ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ba1);
  std::__cxx11::string::~string(local_2b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b79);
  test::Tester::~Tester((Tester *)(local_2b58 + 8));
  test::Tester::Tester
            ((Tester *)(local_2d50 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x376);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d70,"b",&local_2d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d98,"vb2",&local_2d99);
  DBTest::Put((DBTest *)local_2d50,(string *)this,(string *)local_2d70);
  test::Tester::IsOk((Tester *)(local_2d50 + 8),(Status *)local_2d50);
  Status::~Status((Status *)local_2d50);
  std::__cxx11::string::~string(local_2d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d99);
  std::__cxx11::string::~string(local_2d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d71);
  test::Tester::~Tester((Tester *)(local_2d50 + 8));
  test::Tester::Tester
            ((Tester *)(local_2f48 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x377);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f68,"c",&local_2f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f90,"vc2",&local_2f91);
  DBTest::Put((DBTest *)local_2f48,(string *)this,(string *)local_2f68);
  test::Tester::IsOk((Tester *)(local_2f48 + 8),(Status *)local_2f48);
  Status::~Status((Status *)local_2f48);
  std::__cxx11::string::~string(local_2f90);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f91);
  std::__cxx11::string::~string(local_2f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f69);
  test::Tester::~Tester((Tester *)(local_2f48 + 8));
  test::Tester::Tester
            ((Tester *)(local_3140 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3160,"b",&local_3161);
  DBTest::Delete((DBTest *)local_3140,(string *)this);
  test::Tester::IsOk((Tester *)(local_3140 + 8),(Status *)local_3140);
  Status::~Status((Status *)local_3140);
  std::__cxx11::string::~string(local_3160);
  std::allocator<char>::~allocator((allocator<char> *)&local_3161);
  test::Tester::~Tester((Tester *)(local_3140 + 8));
  (**(code **)(*local_610 + 0x18))();
  test::Tester::Tester
            ((Tester *)(local_3328 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x37a);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_3328,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_3328 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3328,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_3328);
  test::Tester::~Tester((Tester *)(local_3328 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_34e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x37c);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_34e8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_34e8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_34e8,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_34e8);
  test::Tester::~Tester((Tester *)(local_34e8 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_36a8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x37e);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_36a8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_36a8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_36a8,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_36a8);
  test::Tester::~Tester((Tester *)(local_36a8 + 0x20));
  (**(code **)(*local_610 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_3868 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x380);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_3868,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_3868 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3868,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_3868);
  test::Tester::~Tester((Tester *)(local_3868 + 0x20));
  (**(code **)(*local_610 + 0x20))();
  test::Tester::Tester
            ((Tester *)(local_3a28 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x382);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_3a28,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_3a28 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a28,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_3a28);
  test::Tester::~Tester((Tester *)(local_3a28 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_3be8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,900);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_3be8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_3be8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3be8,
             (char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)local_3be8);
  test::Tester::~Tester((Tester *)(local_3be8 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_3da8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x386);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_3da8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_3da8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3da8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_3da8);
  test::Tester::~Tester((Tester *)(local_3da8 + 0x20));
  (**(code **)(*local_610 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_3f68 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x388);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_3f68,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_3f68 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f68,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_3f68);
  test::Tester::~Tester((Tester *)(local_3f68 + 0x20));
  if (local_610 != (long *)0x0) {
    (**(code **)(*local_610 + 8))();
  }
  return;
}

Assistant:

TEST(DBTest, IterMulti) {
  ASSERT_OK(Put("a", "va"));
  ASSERT_OK(Put("b", "vb"));
  ASSERT_OK(Put("c", "vc"));
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("a");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("ax");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("b");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("z");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  // Switch from reverse to forward
  iter->SeekToLast();
  iter->Prev();
  iter->Prev();
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Switch from forward to reverse
  iter->SeekToFirst();
  iter->Next();
  iter->Next();
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Make sure iter stays at snapshot
  ASSERT_OK(Put("a", "va2"));
  ASSERT_OK(Put("a2", "va3"));
  ASSERT_OK(Put("b", "vb2"));
  ASSERT_OK(Put("c", "vc2"));
  ASSERT_OK(Delete("b"));
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}